

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_util.h
# Opt level: O3

bool FileExist(char *filename)

{
  int iVar1;
  ostream *poVar2;
  size_t sVar3;
  Logger local_6c;
  string local_68;
  string local_48;
  
  iVar1 = access(filename,0);
  if (iVar1 == -1) {
    local_6c.severity_ = WARNING;
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/base/file_util.h"
               ,"");
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"FileExist","");
    poVar2 = Logger::Start(WARNING,&local_48,0x82,&local_68);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"File: ",6);
    if (filename == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(filename);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,filename,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," doesn\'t exists.",0x10);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
    Logger::~Logger(&local_6c);
  }
  return iVar1 != -1;
}

Assistant:

inline bool FileExist(const char *filename) {
  if (access(filename, F_OK) != -1) {
    return true;
  }
  LOG(WARNING) << "File: " << filename << " doesn't exists.";
  return false;
}